

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PreAndPostIncOperatorCheck::throwIfVariableFound
          (PreAndPostIncOperatorCheck *this,VariableList *list,VariableRef *v)

{
  Expression *pEVar1;
  bool bVar2;
  CompileMessage local_58;
  VariableRef *local_20;
  VariableRef *v_local;
  VariableList *list_local;
  PreAndPostIncOperatorCheck *this_local;
  
  local_20 = v;
  v_local = (VariableRef *)list;
  list_local = (VariableList *)this;
  bVar2 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,16ul>,soul::pool_ref<soul::AST::VariableDeclaration>&>
                    (list,&v->variable);
  if (!bVar2) {
    return;
  }
  pEVar1 = &local_20->super_Expression;
  Errors::preIncDecCollision<>();
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_58,false);
}

Assistant:

void throwIfVariableFound (VariableList& list, AST::VariableRef& v)
        {
            if (contains (list, v.variable))
                v.context.throwError (Errors::preIncDecCollision());
        }